

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueType.cpp
# Opt level: O3

ValueType __thiscall ValueType::ToPrimitiveOrObject(ValueType *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Bits BVar4;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_1a;
  
  BVar4 = (this->field_0).bits;
  if ((BVar4 & Object) == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x410,"(OneOn(Bits::Object))","OneOn(Bits::Object)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
    BVar4 = (this->field_0).bits;
  }
  ValueType((ValueType *)&local_1a.field_0,
            BVar4 & (CanBeTaggedValue|Null|Undefined|Likely) | PrimitiveOrObject);
  Verify((ValueType)local_1a.field_0);
  return (anon_union_2_4_ea848c7b_for_ValueType_13)
         (anon_union_2_4_ea848c7b_for_ValueType_13)local_1a.field_0;
}

Assistant:

ValueType ValueType::ToPrimitiveOrObject() const
{
    // When an object type is merged with a non-object type, the PrimitiveOrObject bit is set in the merged type by converting
    // the object type to a PrimitiveOrObject type (preserving only the common bits other than Object) and merging it with the
    // non-object type. The PrimitiveOrObject type will not have the Object bit set, so that it can still be queried for whether
    // it was any of the other types.
    Assert(OneOn(Bits::Object));
    return Verify(bits & (BitPattern(VALUE_TYPE_COMMON_BIT_COUNT) - Bits::Object) | Bits::PrimitiveOrObject);
}